

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

FunctionBody *
TTD::NSSnapValues::InflateTopLevelLoadedFunctionBodyInfo
          (TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo,ScriptContext *ctx)

{
  byte *script;
  DWORD_PTR sourceContext;
  ExecutionInfoManager *this;
  SourceContextInfo *pSVar1;
  JavascriptFunction *this_00;
  ParseableFunctionInfo *pfi;
  FunctionBody *body;
  uint uVar2;
  ScriptContext *__localScriptContext;
  char *msg;
  Utf8SourceInfo *pUVar3;
  void *unaff_retaddr;
  undefined1 auStack_148 [8];
  ScriptEntryExitRecord __entryExitRecord;
  SRCINFO local_108;
  undefined1 local_e0 [8];
  EnterScriptObject __enterScriptObject;
  CompileScriptException se;
  Utf8SourceInfo *local_48;
  Utf8SourceInfo *utf8SourceInfo;
  ModuleID local_34;
  
  script = (fbInfo->TopLevelBase).SourceBuffer;
  pUVar3 = (Utf8SourceInfo *)(ulong)(fbInfo->TopLevelBase).ByteLength;
  sourceContext = (fbInfo->TopLevelBase).SourceContextId;
  pSVar1 = Js::ScriptContext::GetSourceContextInfo(ctx,sourceContext,(SimpleDataCacheWrapper *)0x0);
  if (pSVar1 != (SourceContextInfo *)0x0) {
    TTDAbort_unrecoverable_error
              (
              "On inflate we should either have clean ctxts or we want to optimize the inflate process by skipping redoing this work!!!"
              );
  }
  utf8SourceInfo = pUVar3;
  if ((fbInfo->LoadFlag >> 6 & 1) == (uint)(fbInfo->TopLevelBase).IsUtf8) {
    pSVar1 = Js::ScriptContext::CreateSourceContextInfo
                       (ctx,sourceContext,(fbInfo->TopLevelBase).SourceUri.Contents,
                        (ulong)(fbInfo->TopLevelBase).SourceUri.Length,(SimpleDataCacheWrapper *)0x0
                        ,(char16 *)0x0,0);
    uVar2 = (uint)utf8SourceInfo >>
            ((fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None);
    local_34 = (fbInfo->TopLevelBase).ModuleId;
    Memory::Recycler::WBSetBit((char *)&local_108);
    local_108.sourceContextInfo.ptr = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_108);
    local_108.dlnHost = 0;
    local_108.ulColumnHost = 0;
    local_108.lnMinHost = 0;
    local_108.ichMinHost = 0;
    local_108.ulCharOffset = 0;
    local_108.moduleID = local_34;
    local_108.grfsi = 0;
    local_48 = (Utf8SourceInfo *)0x0;
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    local_108.ichLimHost = uVar2;
    if ((fbInfo->TopLevelBase).DbgSerializedBytecodeSize == 0) {
      this_00 = Js::ScriptContext::LoadScript
                          (ctx,script,(size_t)utf8SourceInfo,&local_108,
                           (CompileScriptException *)&__enterScriptObject.library,&local_48,
                           L"Global code",fbInfo->LoadFlag,(Var)0x0);
      if (this_00 != (JavascriptFunction *)0x0) {
        pfi = Js::JavascriptFunction::GetParseableFunctionInfo(this_00);
        body = JsSupport::ForceAndGetFunctionBody(pfi);
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_148 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        Js::EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_e0,ctx,(ScriptEntryExitRecord *)auStack_148,
                   unaff_retaddr,&stack0x00000000,true,false,false);
        Js::ScriptContext::OnScriptStart(ctx,false,true);
        Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_e0);
        ScriptContextTTD::ProcessFunctionBodyOnLoad(ctx->TTDContextInfo,body,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterLoadedScript
                  (ctx->TTDContextInfo,body,(fbInfo->TopLevelBase).TopLevelBodyCtr);
        ((body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        m_sourceInfoId = (fbInfo->TopLevelBase).TopLevelBodyCtr;
        Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_e0);
        this = ctx->threadContext->TTDExecutionInfo;
        if ((this != (ExecutionInfoManager *)0x0) &&
           ((fbInfo->LoadFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_None)) {
          ExecutionInfoManager::ProcessScriptLoad
                    (this,ctx,(fbInfo->TopLevelBase).TopLevelBodyCtr,body,local_48,
                     (CompileScriptException *)&__enterScriptObject.library);
        }
        CompileScriptException::~CompileScriptException
                  ((CompileScriptException *)&__enterScriptObject.library);
        return body;
      }
      msg = "Something went wrong";
    }
    else {
      msg = "Not implemented yet -- this branch should never be taken.";
    }
    TTDAbort_unrecoverable_error(msg);
  }
  TTDAbort_unrecoverable_error("Utf8 status is inconsistent!!!");
}

Assistant:

Js::FunctionBody* InflateTopLevelLoadedFunctionBodyInfo(const TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo, Js::ScriptContext* ctx)
        {
            byte* script = fbInfo->TopLevelBase.SourceBuffer;
            uint32 scriptLength = fbInfo->TopLevelBase.ByteLength;
            uint64 sourceContext = fbInfo->TopLevelBase.SourceContextId;

            TTDAssert(ctx->GetSourceContextInfo((DWORD_PTR)sourceContext, nullptr) == nullptr, "On inflate we should either have clean ctxts or we want to optimize the inflate process by skipping redoing this work!!!");
            TTDAssert(fbInfo->TopLevelBase.IsUtf8 == ((fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source), "Utf8 status is inconsistent!!!");

            const char16* srcUri = fbInfo->TopLevelBase.SourceUri.Contents;
            uint32 srcUriLength = fbInfo->TopLevelBase.SourceUri.Length;

            SourceContextInfo * sourceContextInfo = ctx->CreateSourceContextInfo((DWORD_PTR)sourceContext, srcUri, srcUriLength, nullptr);

            TTDAssert(fbInfo->TopLevelBase.IsUtf8 || sizeof(wchar) == sizeof(char16), "Non-utf8 code only allowed on windows!!!");
            const int chsize = (fbInfo->LoadFlag & LoadScriptFlag_Utf8Source) ? sizeof(char) : sizeof(char16);
            SRCINFO si = {
                /* sourceContextInfo   */ sourceContextInfo,
                /* dlnHost             */ 0,
                /* ulColumnHost        */ 0,
                /* lnMinHost           */ 0,
                /* ichMinHost          */ 0,
                /* ichLimHost          */ static_cast<ULONG>(scriptLength / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
                /* ulCharOffset        */ 0,
                /* mod                 */ fbInfo->TopLevelBase.ModuleId,
                /* grfsi               */ 0
            };

            Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
            CompileScriptException se;
            Js::JavascriptFunction* scriptFunction = nullptr;
            Js::FunctionBody* globalBody = nullptr;

            if(fbInfo->TopLevelBase.DbgSerializedBytecodeSize != 0)
            {
                //
                //TODO: Bytecode serializer does not support debug bytecode (StatementMaps vs Positions) so add this to serializer code.
                //      Then we can add code do optimized bytecode reload here.
                //
                TTDAssert(false, "Not implemented yet -- this branch should never be taken.");
            }
            else
            {
                scriptFunction = ctx->LoadScript(script, scriptLength, &si, &se, &utf8SourceInfo, Js::Constants::GlobalCode, fbInfo->LoadFlag, nullptr);
                TTDAssert(scriptFunction != nullptr, "Something went wrong");

                globalBody = TTD::JsSupport::ForceAndGetFunctionBody(scriptFunction->GetParseableFunctionInfo());

                //
                //TODO: Bytecode serializer does not suppper debug bytecode (StatementMaps vs Positions) so add this to serializer code.
                //      Then we can add code to do optimized bytecode reload here.
                //
            }

            ////
            //We don't do this automatically in the load script helper so do it here
            BEGIN_JS_RUNTIME_CALL(ctx);
            {
                ctx->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                ctx->TTDContextInfo->RegisterLoadedScript(globalBody, fbInfo->TopLevelBase.TopLevelBodyCtr);

                globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(fbInfo->TopLevelBase.TopLevelBodyCtr);
            }
            END_JS_RUNTIME_CALL(ctx);

            bool isLibraryCode = ((fbInfo->LoadFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode);
            if(ctx->GetThreadContext()->TTDExecutionInfo != nullptr && !isLibraryCode)
            {
                ctx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(ctx, fbInfo->TopLevelBase.TopLevelBodyCtr, globalBody, utf8SourceInfo, &se);
            }
            ////

            return globalBody;
        }